

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O2

void __thiscall
crnlib::
hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
::reserve(hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
          *this,uint new_capacity)

{
  uint val;
  int iVar1;
  uint uVar2;
  
  iVar1 = new_capacity + (new_capacity == 0);
  uVar2 = iVar1 * 2 - 1;
  val = iVar1 * 2;
  if ((val ^ uVar2) <= uVar2) {
    val = math::next_pow2(val);
  }
  uVar2 = 4;
  if (4 < val) {
    uVar2 = val;
  }
  if ((this->m_values).m_size < uVar2) {
    rehash(this,uVar2);
    return;
  }
  return;
}

Assistant:

inline void reserve(uint new_capacity)
        {
            uint new_hash_size = math::maximum(1U, new_capacity);

            new_hash_size = new_hash_size * 2U;

            if (!math::is_power_of_2(new_hash_size))
            {
                new_hash_size = math::next_pow2(new_hash_size);
            }

            new_hash_size = math::maximum<uint>(cMinHashSize, new_hash_size);

            if (new_hash_size > m_values.size())
            {
                rehash(new_hash_size);
            }
        }